

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_appender.cpp
# Opt level: O0

void __thiscall
cornelich::excerpt_appender::excerpt_appender(excerpt_appender *this,vanilla_chronicle *chronicle)

{
  vanilla_chronicle *chronicle_local;
  excerpt_appender *this_local;
  
  this->m_chronicle = chronicle;
  std::shared_ptr<cornelich::region>::shared_ptr(&this->m_index_region);
  std::shared_ptr<cornelich::region>::shared_ptr(&this->m_data_region);
  this->m_index = -1;
  this->m_last_cycle = -1;
  this->m_last_index_file_number = -1;
  this->m_last_thread_id = -1;
  this->m_last_data_file_number = -1;
  this->m_finished = true;
  this->m_last_written_index = -1;
  util::buffer_view::buffer_view(&this->m_buffer,&this->m_index);
  return;
}

Assistant:

excerpt_appender::excerpt_appender(vanilla_chronicle & chronicle)
    : m_chronicle(chronicle)
    , m_index(-1)
    , m_last_cycle(-1)
    , m_last_index_file_number(-1)
    , m_last_thread_id(-1)
    , m_last_data_file_number(-1)
    , m_finished(true)
    , m_buffer(m_index)
{
}